

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingbox.cpp
# Opt level: O1

bool __thiscall BoundingBox::containsPoint(BoundingBox *this,vec3 *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (p->field_0).field_0.x;
  if (((((this->min).field_0.field_0.x <= fVar1) &&
       (fVar2 = (p->field_0).field_0.y, (this->min).field_0.field_0.y <= fVar2)) &&
      (fVar3 = (p->field_0).field_0.z, (this->min).field_0.field_0.z <= fVar3)) &&
     ((fVar1 <= (this->max).field_0.field_0.x && (fVar2 <= (this->max).field_0.field_0.y)))) {
    return fVar3 <= (this->max).field_0.field_0.z;
  }
  return false;
}

Assistant:

bool BoundingBox::containsPoint(glm::vec3 &p) {
    return (min.x <= p.x && 
            min.y <= p.y && 
            min.z <= p.z &&
            max.x >= p.x &&
            max.y >= p.y &&
            max.z >= p.z );
}